

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_xpairs(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  int iVar2;
  TRef TVar3;
  TRef local_20;
  TRef tr;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  uVar1 = *J->base;
  if ((((uVar1 & 0x1f000000) != 0xa000000) ||
      (iVar2 = recff_metacall(J,rd,rd->data + MM_pairs), iVar2 == 0)) &&
     ((uVar1 & 0x1f000000) == 0xb000000)) {
    TVar3 = lj_ir_kgc(J,(GCobj *)((J->fn->c).upvalue[0].u64 & 0x7fffffffffff),IRT_FUNC);
    *J->base = TVar3;
    J->base[1] = uVar1;
    if (rd->data == 0) {
      local_20 = 0x7fff;
    }
    else {
      local_20 = lj_ir_kint(J,0);
    }
    J->base[2] = local_20;
    rd->nres = 3;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_xpairs(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (!((LJ_52 || (LJ_HASFFI && tref_iscdata(tr))) &&
	recff_metacall(J, rd, MM_pairs + rd->data))) {
    if (tref_istab(tr)) {
      J->base[0] = lj_ir_kfunc(J, funcV(&J->fn->c.upvalue[0]));
      J->base[1] = tr;
      J->base[2] = rd->data ? lj_ir_kint(J, 0) : TREF_NIL;
      rd->nres = 3;
    }  /* else: Interpreter will throw. */
  }
}